

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type_test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3c48d::FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test
::TestBody(FieldTypeTest_TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType_Test *this)

{
  char *message;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_._0_1_ = 0x20;
  local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x20);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
            ((internal *)&gtest_ar,"FieldTypeEnum::UNRECOGNISED",
             "FieldTypeMethods::ValueOf((int) FieldTypeEnum::UNRECOGNISED)",
             (FieldTypeEnum *)&local_28,(FieldTypeEnum *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
               ,0x23,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FieldTypeTest, TestValueOfUnrecognisedCodeReturnsUnrecognisedFieldType)
{
    ASSERT_EQ(FieldTypeEnum::UNRECOGNISED, FieldTypeMethods::ValueOf((int) FieldTypeEnum::UNRECOGNISED));
}